

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O2

void chrono::utils::AddConvexCollisionModel
               (shared_ptr<chrono::ChBody> *body,shared_ptr<chrono::ChMaterialSurface> *material,
               shared_ptr<chrono::geometry::ChTriangleMeshConnected> *convex_mesh,
               vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
               *convex_hulls,ChVector<double> *pos,ChQuaternion<double> *rot,
               shared_ptr<chrono::ChVisualMaterial> vis_material)

{
  pointer pvVar1;
  element_type *this;
  element_type *peVar2;
  long lVar3;
  ulong uVar4;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  shared_ptr<chrono::ChVisualShape> local_118;
  undefined1 local_108 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_c8;
  shared_ptr<chrono::ChVisualModel> model;
  
  lVar3 = 0;
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)(convex_hulls->
                             super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(convex_hulls->
                            super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar4 = uVar4 + 1)
  {
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               &trimesh_shape,
               &(((body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                collision_model).
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    peVar2 = trimesh_shape.
             super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_c8,
               &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
    ;
    pvVar1 = (convex_hulls->
             super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ChMatrix33<double>::Set_A_quaternion((ChMatrix33<double> *)&model,rot);
    (*(peVar2->super_ChVisualShape)._vptr_ChVisualShape[0xf])
              (peVar2,&local_c8,
               (long)&(pvVar1->
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar3,pos,
               (ChMatrix33<double> *)&model);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&trimesh_shape.
                super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    lVar3 = lVar3 + 0x18;
  }
  ChPhysicsItem::GetVisualModel((ChPhysicsItem *)&model);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::make_shared<chrono::ChVisualModel>();
    this = (body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d8,
               &model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>);
    ChPhysicsItem::AddVisualModel
              (&this->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)&local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
  peVar2 = trimesh_shape.super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_e8,
               &convex_mesh->
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              );
  ChTriangleMeshShape::SetMesh
            (peVar2,(shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)&local_e8,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
  std::__cxx11::string::_M_assign
            ((string *)
             &(trimesh_shape.
               super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              name);
  std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *)
             (local_108 + 0x10),
             (__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *)
             vis_material.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  ChVisualShape::AddMaterial
            (&(trimesh_shape.
               super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_ChVisualShape,(shared_ptr<chrono::ChVisualMaterial> *)(local_108 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
  ChPhysicsItem::GetVisualModel((ChPhysicsItem *)local_108);
  std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChTriangleMeshShape,void>
            ((__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> *)&local_118,
             &trimesh_shape.
              super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>);
  ChFrame<double>::ChFrame((ChFrame<double> *)&model,pos,rot);
  ChVisualModel::AddShape((ChVisualModel *)local_108._0_8_,&local_118,(ChFrame<double> *)&model);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trimesh_shape.
              super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void AddConvexCollisionModel(std::shared_ptr<ChBody> body,
                             std::shared_ptr<ChMaterialSurface> material,
                             std::shared_ptr<ChTriangleMeshConnected> convex_mesh,
                             std::vector<std::vector<ChVector<double>>>& convex_hulls,
                             const ChVector<>& pos,
                             const ChQuaternion<>& rot,
                             std::shared_ptr<ChVisualMaterial> vis_material) {
    for (int c = 0; c < convex_hulls.size(); c++) {
        body->GetCollisionModel()->AddConvexHull(material, convex_hulls[c], pos, rot);
    }

    if (!body->GetVisualModel()) {
        auto model = chrono_types::make_shared<ChVisualModel>();
        body->AddVisualModel(model);
    }

    // Add the original triangle mesh as asset
    auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
    trimesh_shape->SetMesh(convex_mesh);
    trimesh_shape->SetName(convex_mesh->GetFileName());
    trimesh_shape->AddMaterial(vis_material);
    body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>(pos, rot));
}